

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_CommitAfterAppending4Mb_Test::TestBody(Transaction_CommitAfterAppending4Mb_Test *this)

{
  long lVar1;
  element_type *peVar2;
  long lVar3;
  element_type *peVar4;
  char *pcVar5;
  mock_mutex mutex;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  database db;
  AssertHelper AStack_188;
  unique_lock<mock_mutex> local_180;
  undefined1 local_170 [8];
  database *local_168;
  mutex_type *local_148;
  bool local_140;
  database local_138;
  
  pstore::database::database<pstore::file::in_memory>
            (&local_138,&(this->super_Transaction).store_.file_,true);
  local_138.vacuum_mode_ = disabled;
  local_180._M_owns = false;
  local_180._M_device = (mutex_type *)&AStack_188;
  std::unique_lock<mock_mutex>::lock(&local_180);
  local_180._M_owns = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_170,&local_138,&local_180);
  if ((local_180._M_owns == true) && (local_180._M_device != (mutex_type *)0x0)) {
    local_180._M_owns = false;
  }
  pstore::transaction_base::allocate((transaction_base *)local_170,0x400000,1);
  pstore::transaction_base::commit((transaction_base *)local_170);
  local_170 = (undefined1  [8])&PTR__transaction_00271290;
  pstore::transaction_base::rollback((transaction_base *)local_170);
  if ((local_140 == true) && (local_148 != (mutex_type *)0x0)) {
    local_140 = false;
  }
  lVar1 = *(long *)((this->super_Transaction).store_.buffer_.
                    super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28);
  peVar2 = (this->super_Transaction).store_.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_180._M_device = *(mutex_type **)(peVar2 + lVar1);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(local_170,(char *)&local_180,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),"Did not find r1 footer signature1",0x21);
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10b,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  local_180._M_device = (mutex_type *)CONCAT44(local_180._M_device._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_int>>
            ((internal *)local_170,"1U","r1_footer->a.generation",(uint *)&local_180,
             (atomic<unsigned_int> *)(peVar2 + lVar1 + 8));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),"r1 footer generation number must be 1",0x25)
    ;
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10d,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  local_180._M_device = (mutex_type *)CONCAT44(local_180._M_device._4_4_,0x400000);
  testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_long>>
            ((internal *)local_170,"4194304U","r1_footer->a.size",(uint *)&local_180,
             (atomic<unsigned_long> *)(peVar2 + lVar1 + 0x10));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10e,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  local_180._M_device = *(mutex_type **)(peVar2 + lVar1 + 0x68);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(local_170,(char *)&local_180,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),"Did not find r1 footer signature2",0x21);
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x110,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  lVar3 = *(long *)(peVar2 + lVar1 + 0x20);
  peVar4 = (this->super_Transaction).store_.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_180._M_device = *(mutex_type **)(peVar4 + lVar3);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(local_170,(char *)&local_180,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),"Did not find r0 footer signature1",0x21);
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x119,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  local_180._M_device = (mutex_type *)((ulong)local_180._M_device & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_int>>
            ((internal *)local_170,"0U","r0_footer->a.generation",(uint *)&local_180,
             (atomic<unsigned_int> *)(peVar4 + lVar3 + 8));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),"r0 footer generation number must be 0",0x25)
    ;
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11b,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  local_180._M_device = (mutex_type *)((ulong)local_180._M_device & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_long>>
            ((internal *)local_170,"0U","r0_footer->a.size",(uint *)&local_180,
             (atomic<unsigned_long> *)(peVar4 + lVar3 + 0x10));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),"expected the r0 footer size value to be 0",
               0x29);
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11c,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  local_180._M_device = (mutex_type *)0x0;
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)local_170,"pstore::typed_address<pstore::trailer>::null ()",
             "r0_footer->a.prev_generation",(typed_address<pstore::trailer> *)&local_180,
             (typed_address<pstore::trailer> *)(peVar4 + lVar3 + 0x20));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),
               "The r0 footer should not point to a previous generation",0x37);
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11d,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  local_180._M_device = *(mutex_type **)(peVar4 + lVar3 + 0x68);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(local_170,(char *)&local_180,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),"Did not find r0 footer signature2",0x21);
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x120,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  testing::internal::CmpHelperGE<std::atomic<unsigned_long>,std::atomic<unsigned_long>>
            ((internal *)local_170,"r1_footer->a.time","r0_footer->a.time",
             (atomic<unsigned_long> *)(peVar2 + lVar1 + 0x18),
             (atomic<unsigned_long> *)(peVar4 + lVar3 + 0x18));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_device + 0x10),"r1 time must not be earlier than r0 time",
               0x28);
    if (local_168 == (database *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&local_168->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x123,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  if (local_168 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  }
  pstore::database::~database(&local_138);
  return;
}

Assistant:

TEST_F (Transaction, CommitAfterAppending4Mb) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});

        std::size_t const elements = (4U * 1024U * 1024U) / sizeof (int);
        transaction.allocate (elements * sizeof (int), 1 /*align*/);
        transaction.commit ();
    }

    // Check the two footers.
    {
        pstore::header const * const header = this->get_header ();
        pstore::typed_address<pstore::trailer> const r1_footer_offset = header->footer_pos;

        auto r1_footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                    r1_footer_offset.absolute ());
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r1_footer->a.signature1))
            << "Did not find r1 footer signature1";
        EXPECT_EQ (1U, r1_footer->a.generation) << "r1 footer generation number must be 1";
        EXPECT_EQ (4194304U, r1_footer->a.size);
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r1_footer->signature2))
            << "Did not find r1 footer signature2";

        pstore::typed_address<pstore::trailer> const r0_footer_offset =
            r1_footer->a.prev_generation;

        auto r0_footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                    r0_footer_offset.absolute ());
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0_footer->a.signature1))
            << "Did not find r0 footer signature1";
        EXPECT_EQ (0U, r0_footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0_footer->a.size) << "expected the r0 footer size value to be 0";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0_footer->a.prev_generation)
            << "The r0 footer should not point to a previous generation";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0_footer->signature2))
            << "Did not find r0 footer signature2";

        EXPECT_GE (r1_footer->a.time, r0_footer->a.time)
            << "r1 time must not be earlier than r0 time";
    }
}